

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpathsimplifier.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_d7297f::PathSimplifier::intersectNodes
          (PathSimplifier *this,
          QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*> *elements,
          BVHNode *elementNode,BVHNode *treeNode)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*> *elements_00;
  BVHNode *pBVar5;
  QPoint *pQVar6;
  size_type sVar7;
  BVHNode *in_RCX;
  QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*> *in_RDX;
  PathSimplifier *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  double __x;
  int i;
  QPoint *v2;
  QPoint *v1;
  QPoint *u2;
  QPoint *u1;
  Element *nodeElement;
  Element *element;
  pair<int,_int> range2;
  pair<int,_int> range1;
  IntersectionPoint intersection;
  QVarLengthArray<QPoint,_12LL> axes;
  QPoint *in_stack_fffffffffffffe88;
  undefined7 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe97;
  Element *in_stack_fffffffffffffea0;
  QPoint *in_stack_fffffffffffffea8;
  PathSimplifier *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  Element *in_stack_fffffffffffffec0;
  PathSimplifier *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  int local_10c;
  PathSimplifier *this_00;
  bool local_b1;
  pair<int,_int> in_stack_ffffffffffffff50;
  pair<int,_int> in_stack_ffffffffffffff58;
  PathSimplifier *in_stack_ffffffffffffff60;
  undefined1 *local_98;
  undefined1 *local_90;
  Fraction local_88;
  QVLABaseBase local_80 [2];
  Element *in_stack_ffffffffffffffb0;
  QVarLengthArray<QPoint,_12LL> *in_stack_ffffffffffffffb8;
  PathSimplifier *in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = QPoint::x((QPoint *)0x5e9e56);
  iVar4 = QPoint::x((QPoint *)0x5e9e6b);
  if (iVar3 < iVar4) {
    iVar3 = QPoint::y((QPoint *)0x5e9e8a);
    iVar4 = QPoint::y((QPoint *)0x5e9e9f);
    if (iVar3 < iVar4) {
      iVar3 = QPoint::x((QPoint *)0x5e9eba);
      iVar4 = QPoint::x((QPoint *)0x5e9ecf);
      if (iVar4 < iVar3) {
        iVar3 = QPoint::y((QPoint *)0x5e9eea);
        iVar4 = QPoint::y((QPoint *)0x5e9eff);
        if (iVar4 < iVar3) {
          pBVar5 = (BVHNode *)in_RDX[1].capacity;
          if (in_RCX->type == Leaf) {
            this_00 = (PathSimplifier *)(in_RCX->field_3).element;
            if (((ushort)(this_00->m_bvh).blockSize >> 8 & 1) == 0) {
              local_b1 = false;
            }
            else if ((in_RCX->field_3).element == (Element *)in_RDX[1].capacity) {
              local_b1 = false;
            }
            else {
              bVar2 = equalElements(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                                    (Element *)
                                    CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
              if (bVar2) {
                local_b1 = false;
              }
              else if (((pBVar5[1].maximum.yp.m_i & 0xff) == 1) &&
                      (((this_00->m_bvh).blockSize & 0xff) == 1)) {
                elements_00 = (QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*> *)
                              QDataBuffer<QPoint>::at
                                        (*(QDataBuffer<QPoint> **)(in_RDI + 0x20),
                                         (ulong)(uint)(pBVar5->minimum).yp.m_i);
                pBVar5 = (BVHNode *)
                         QDataBuffer<QPoint>::at
                                   (*(QDataBuffer<QPoint> **)(in_RDI + 0x20),
                                    (ulong)(uint)(pBVar5->maximum).xp.m_i);
                pQVar6 = QDataBuffer<QPoint>::at
                                   (*(QDataBuffer<QPoint> **)(in_RDI + 0x20),
                                    (ulong)(uint)(this_00->m_elements).capacity);
                QDataBuffer<QPoint>::at
                          (*(QDataBuffer<QPoint> **)(in_RDI + 0x20),
                           (ulong)*(uint *)((long)&(this_00->m_elements).capacity + 4));
                local_98 = &DAT_aaaaaaaaaaaaaaaa;
                local_90 = &DAT_aaaaaaaaaaaaaaaa;
                local_88 = (Fraction)&DAT_aaaaaaaaaaaaaaaa;
                intersectionPoint((QPoint *)CONCAT44(iVar3,in_stack_fffffffffffffed0),
                                  (QPoint *)in_stack_fffffffffffffec8,
                                  &in_stack_fffffffffffffec0->middle,
                                  (QPoint *)
                                  CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
                bVar2 = IntersectionPoint::isValid
                                  ((IntersectionPoint *)
                                   CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
                if (bVar2) {
                  IntersectionPoint::round((IntersectionPoint *)&local_98,__x);
                  QDataBuffer<QPoint>::add
                            ((QDataBuffer<QPoint> *)
                             CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
                             in_stack_fffffffffffffe88);
                  QDataBuffer<QPoint>::size(*(QDataBuffer<QPoint> **)(in_RDI + 0x20));
                  IntersectionPoint::isAccurate((IntersectionPoint *)&local_98);
                  splitLineAt(this_00,elements_00,pBVar5,(quint32)((ulong)pQVar6 >> 0x20),
                              SUB81((ulong)pQVar6 >> 0x18,0));
                  QDataBuffer<QPoint>::size(*(QDataBuffer<QPoint> **)(in_RDI + 0x20));
                  local_b1 = splitLineAt(this_00,elements_00,pBVar5,(quint32)((ulong)pQVar6 >> 0x20)
                                         ,SUB81((ulong)pQVar6 >> 0x18,0));
                }
                else {
                  local_b1 = false;
                }
              }
              else {
                memset(local_80,0xaa,0x78);
                QVarLengthArray<QPoint,_12LL>::QVarLengthArray
                          ((QVarLengthArray<QPoint,_12LL> *)local_80);
                appendSeparatingAxes
                          (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                           in_stack_ffffffffffffffb0);
                appendSeparatingAxes
                          (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                           in_stack_ffffffffffffffb0);
                local_10c = 0;
                while( true ) {
                  sVar7 = QVLABaseBase::size(local_80);
                  if (sVar7 <= local_10c) break;
                  QVarLengthArray<QPoint,_12LL>::at
                            ((QVarLengthArray<QPoint,_12LL> *)
                             CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
                             (qsizetype)in_stack_fffffffffffffe88);
                  in_stack_ffffffffffffff58 =
                       calculateSeparatingAxisRange
                                 (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                                  in_stack_fffffffffffffea0);
                  QVarLengthArray<QPoint,_12LL>::at
                            ((QVarLengthArray<QPoint,_12LL> *)
                             CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
                             (qsizetype)in_stack_fffffffffffffe88);
                  in_stack_ffffffffffffff50 =
                       calculateSeparatingAxisRange
                                 (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                                  in_stack_fffffffffffffea0);
                  if ((in_stack_ffffffffffffff50.second <= in_stack_ffffffffffffff58.first) ||
                     (in_stack_ffffffffffffff58.second <= in_stack_ffffffffffffff50.first)) {
                    local_b1 = false;
                    goto LAB_005ea498;
                  }
                  local_10c = local_10c + 1;
                }
                if (1 < ((ushort)(this_00->m_bvh).blockSize & 0xff)) {
                  splitCurve(in_stack_ffffffffffffff60,
                             (QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*> *)
                             in_stack_ffffffffffffff58,(BVHNode *)in_stack_ffffffffffffff50);
                }
                if (((ushort)pBVar5[1].maximum.yp.m_i & 0xff) < 2) {
                  bVar2 = intersectNodes(in_RSI,in_RDX,in_RCX,pBVar5);
                  if (bVar2) {
                    local_b1 = true;
                  }
                  else {
                    bVar2 = intersectNodes(in_RSI,in_RDX,in_RCX,pBVar5);
                    if (bVar2) {
                      local_b1 = true;
                    }
                    else {
                      local_b1 = false;
                    }
                  }
                }
                else {
                  splitCurve(in_stack_ffffffffffffff60,
                             (QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*> *)
                             in_stack_ffffffffffffff58,(BVHNode *)in_stack_ffffffffffffff50);
                  local_b1 = true;
                }
LAB_005ea498:
                QVarLengthArray<QPoint,_12LL>::~QVarLengthArray
                          ((QVarLengthArray<QPoint,_12LL> *)
                           CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
              }
            }
          }
          else {
            bVar2 = intersectNodes(in_RSI,in_RDX,in_RCX,pBVar5);
            if (bVar2) {
              local_b1 = true;
            }
            else {
              bVar2 = intersectNodes(in_RSI,in_RDX,in_RCX,pBVar5);
              if (bVar2) {
                local_b1 = true;
              }
              else {
                local_b1 = false;
              }
            }
          }
          goto LAB_005ea51b;
        }
      }
    }
  }
  local_b1 = false;
LAB_005ea51b:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_b1;
  }
  __stack_chk_fail();
}

Assistant:

bool PathSimplifier::intersectNodes(QDataBuffer<Element *> &elements, BVHNode *elementNode,
                                    BVHNode *treeNode)
{
    if (elementNode->minimum.x() >= treeNode->maximum.x()
        || elementNode->minimum.y() >= treeNode->maximum.y()
        || elementNode->maximum.x() <= treeNode->minimum.x()
        || elementNode->maximum.y() <= treeNode->minimum.y())
    {
        return false;
    }

    Q_ASSERT(elementNode->type == BVHNode::Leaf);
    Element *element = elementNode->element;
    Q_ASSERT(!element->processed);

    if (treeNode->type == BVHNode::Leaf) {
        Element *nodeElement = treeNode->element;
        if (!nodeElement->processed)
            return false;

        if (treeNode->element == elementNode->element)
            return false;

        if (equalElements(treeNode->element, elementNode->element))
            return false; // element doesn't split itself.

        if (element->degree == Element::Line && nodeElement->degree == Element::Line) {
            const QPoint &u1 = m_points->at(element->indices[0]);
            const QPoint &u2 = m_points->at(element->indices[1]);
            const QPoint &v1 = m_points->at(nodeElement->indices[0]);
            const QPoint &v2 = m_points->at(nodeElement->indices[1]);
            IntersectionPoint intersection = intersectionPoint(u1, u2, v1, v2);
            if (!intersection.isValid())
                return false;

            Q_ASSERT(intersection.x.integer >= qMin(u1.x(), u2.x()));
            Q_ASSERT(intersection.y.integer >= qMin(u1.y(), u2.y()));
            Q_ASSERT(intersection.x.integer >= qMin(v1.x(), v2.x()));
            Q_ASSERT(intersection.y.integer >= qMin(v1.y(), v2.y()));

            Q_ASSERT(intersection.x.integer <= qMax(u1.x(), u2.x()));
            Q_ASSERT(intersection.y.integer <= qMax(u1.y(), u2.y()));
            Q_ASSERT(intersection.x.integer <= qMax(v1.x(), v2.x()));
            Q_ASSERT(intersection.y.integer <= qMax(v1.y(), v2.y()));

            m_points->add(intersection.round());
            splitLineAt(elements, treeNode, m_points->size() - 1, !intersection.isAccurate());
            return splitLineAt(elements, elementNode, m_points->size() - 1, false);
        } else {
            QVarLengthArray<QPoint, 12> axes;
            appendSeparatingAxes(axes, elementNode->element);
            appendSeparatingAxes(axes, treeNode->element);
            for (int i = 0; i < axes.size(); ++i) {
                std::pair<int, int> range1 = calculateSeparatingAxisRange(axes.at(i), elementNode->element);
                std::pair<int, int> range2 = calculateSeparatingAxisRange(axes.at(i), treeNode->element);
                if (range1.first >= range2.second || range1.second <= range2.first) {
                    return false; // Separating axis found.
                }
            }
            // Bounding areas overlap.
            if (nodeElement->degree > Element::Line)
                splitCurve(elements, treeNode);
            if (element->degree > Element::Line) {
                splitCurve(elements, elementNode);
            } else {
                // The element was not split, so it can be processed further.
                if (intersectNodes(elements, elementNode, treeNode->left))
                    return true;
                if (intersectNodes(elements, elementNode, treeNode->right))
                    return true;
                return false;
            }
            return true;
        }
    } else {
        if (intersectNodes(elements, elementNode, treeNode->left))
            return true;
        if (intersectNodes(elements, elementNode, treeNode->right))
            return true;
        return false;
    }
}